

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-timer.c
# Opt level: O3

int run_test_timer(void)

{
  int iVar1;
  int extraout_EAX;
  int extraout_EAX_00;
  uv_loop_t *puVar2;
  char *loop;
  uv_loop_t *handle;
  uv_loop_t *puVar3;
  char *handle_00;
  undefined8 in_R9;
  uint64_t uVar4;
  uv_timer_t never;
  uv_timer_t repeat;
  uv_timer_t once_timers [10];
  undefined1 auStack_738 [152];
  undefined1 local_6a0 [1672];
  
  puVar3 = (uv_loop_t *)auStack_738;
  loop = auStack_738;
  puVar2 = uv_default_loop();
  start_time = uv_now(puVar2);
  if (start_time == 0) {
LAB_00174983:
    run_test_timer_cold_14();
LAB_00174988:
    run_test_timer_cold_3();
LAB_0017498d:
    run_test_timer_cold_4();
LAB_00174992:
    run_test_timer_cold_5();
LAB_00174997:
    loop = (char *)puVar2;
    run_test_timer_cold_6();
LAB_0017499c:
    run_test_timer_cold_7();
LAB_001749a1:
    run_test_timer_cold_8();
LAB_001749a6:
    run_test_timer_cold_9();
LAB_001749ab:
    run_test_timer_cold_10();
LAB_001749b0:
    run_test_timer_cold_11();
  }
  else {
    handle = (uv_loop_t *)(local_6a0 + 0x98);
    uVar4 = 0;
    do {
      puVar2 = uv_default_loop();
      iVar1 = uv_timer_init(puVar2,(uv_timer_t *)handle);
      if (iVar1 != 0) {
LAB_0017497e:
        run_test_timer_cold_1();
        goto LAB_00174983;
      }
      puVar2 = handle;
      iVar1 = uv_timer_start((uv_timer_t *)handle,once_cb,uVar4,0);
      if (iVar1 != 0) {
        run_test_timer_cold_2();
        goto LAB_0017497e;
      }
      handle = (uv_loop_t *)((handle->wq_mutex).__size + 0x10);
      uVar4 = uVar4 + 0x32;
    } while (uVar4 != 500);
    puVar2 = uv_default_loop();
    iVar1 = uv_timer_init(puVar2,(uv_timer_t *)local_6a0);
    if (iVar1 != 0) goto LAB_00174988;
    puVar2 = (uv_loop_t *)local_6a0;
    iVar1 = uv_timer_start((uv_timer_t *)puVar2,repeat_cb,100,100);
    if (iVar1 != 0) goto LAB_0017498d;
    puVar2 = uv_default_loop();
    iVar1 = uv_timer_init(puVar2,(uv_timer_t *)auStack_738);
    if (iVar1 != 0) goto LAB_00174992;
    iVar1 = uv_timer_start((uv_timer_t *)auStack_738,never_cb,100,100);
    puVar2 = puVar3;
    if (iVar1 != 0) goto LAB_00174997;
    iVar1 = uv_timer_stop((uv_timer_t *)auStack_738);
    if (iVar1 != 0) goto LAB_0017499c;
    uv_unref((uv_handle_t *)auStack_738);
    loop = (char *)uv_default_loop();
    uv_run((uv_loop_t *)loop,UV_RUN_DEFAULT);
    if (once_cb_called != 10) goto LAB_001749a1;
    if (once_close_cb_called != 10) goto LAB_001749a6;
    loop = "repeat_cb_called %d\n";
    printf("repeat_cb_called %d\n",(ulong)(uint)repeat_cb_called);
    if (repeat_cb_called != 5) goto LAB_001749ab;
    if (repeat_close_cb_called != 1) goto LAB_001749b0;
    loop = (char *)uv_default_loop();
    uVar4 = uv_now((uv_loop_t *)loop);
    if (499 < uVar4 - start_time) {
      puVar2 = uv_default_loop();
      uv_walk(puVar2,close_walk_cb,(void *)0x0);
      uv_run(puVar2,UV_RUN_DEFAULT);
      loop = (char *)uv_default_loop();
      iVar1 = uv_loop_close((uv_loop_t *)loop);
      if (iVar1 == 0) {
        return 0;
      }
      goto LAB_001749ba;
    }
  }
  run_test_timer_cold_12();
LAB_001749ba:
  run_test_timer_cold_13();
  handle_00 = "ONCE_CB %d\n";
  printf("ONCE_CB %d\n",(ulong)(uint)once_cb_called);
  if ((uv_loop_t *)loop == (uv_loop_t *)0x0) {
    once_cb_cold_2();
  }
  else {
    handle_00 = loop;
    iVar1 = uv_is_active((uv_handle_t *)loop);
    if (iVar1 == 0) {
      once_cb_called = once_cb_called + 1;
      uv_close((uv_handle_t *)loop,once_close_cb);
      puVar2 = uv_default_loop();
      uv_update_time(puVar2);
      return extraout_EAX;
    }
  }
  once_cb_cold_1();
  puts("REPEAT_CB");
  if ((uv_loop_t *)handle_00 == (uv_loop_t *)0x0) {
    repeat_cb_cold_2();
  }
  else {
    iVar1 = uv_is_active((uv_handle_t *)handle_00);
    if (iVar1 == 1) {
      repeat_cb_called = repeat_cb_called + 1;
      if (repeat_cb_called == 5) {
        uv_close((uv_handle_t *)handle_00,repeat_close_cb);
        return extraout_EAX_00;
      }
      return repeat_cb_called;
    }
  }
  repeat_cb_cold_1();
  fprintf(_stderr,"Fatal error in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-timer.c"
          ,0x56,"never_cb should never be called",in_R9,handle_00,loop);
  fflush(_stderr);
  abort();
}

Assistant:

TEST_IMPL(timer) {
  uv_timer_t once_timers[10];
  uv_timer_t *once;
  uv_timer_t repeat, never;
  unsigned int i;
  int r;

  start_time = uv_now(uv_default_loop());
  ASSERT(0 < start_time);

  /* Let 10 timers time out in 500 ms total. */
  for (i = 0; i < ARRAY_SIZE(once_timers); i++) {
    once = once_timers + i;
    r = uv_timer_init(uv_default_loop(), once);
    ASSERT(r == 0);
    r = uv_timer_start(once, once_cb, i * 50, 0);
    ASSERT(r == 0);
  }

  /* The 11th timer is a repeating timer that runs 4 times */
  r = uv_timer_init(uv_default_loop(), &repeat);
  ASSERT(r == 0);
  r = uv_timer_start(&repeat, repeat_cb, 100, 100);
  ASSERT(r == 0);

  /* The 12th timer should not do anything. */
  r = uv_timer_init(uv_default_loop(), &never);
  ASSERT(r == 0);
  r = uv_timer_start(&never, never_cb, 100, 100);
  ASSERT(r == 0);
  r = uv_timer_stop(&never);
  ASSERT(r == 0);
  uv_unref((uv_handle_t*)&never);

  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  ASSERT(once_cb_called == 10);
  ASSERT(once_close_cb_called == 10);
  printf("repeat_cb_called %d\n", repeat_cb_called);
  ASSERT(repeat_cb_called == 5);
  ASSERT(repeat_close_cb_called == 1);

  ASSERT(500 <= uv_now(uv_default_loop()) - start_time);

  MAKE_VALGRIND_HAPPY();
  return 0;
}